

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_test.cpp
# Opt level: O0

void juzzlin::StreamTest::testTrace_traceLoggingLevel_shouldPrintMessage
               (string *message,string *timestampSeparator)

{
  string *message_00;
  string *in_RDI;
  stringstream ss;
  stringstream *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188 [384];
  string *local_8;
  
  local_8 = in_RDI;
  std::__cxx11::stringstream::stringstream(local_198);
  juzzlin::SimpleLogger::setStream(Trace,local_188);
  juzzlin::SimpleLogger::setLoggingLevel(Trace);
  juzzlin::SimpleLogger::SimpleLogger((SimpleLogger *)&stack0xfffffffffffffe50);
  message_00 = (string *)juzzlin::SimpleLogger::trace_abi_cxx11_();
  std::operator<<((ostream *)message_00,local_8);
  juzzlin::SimpleLogger::~SimpleLogger((SimpleLogger *)&stack0xfffffffffffffe50);
  assertMessage(in_stack_fffffffffffffe50,message_00,(string *)0x1067db);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void testTrace_traceLoggingLevel_shouldPrintMessage(const std::string & message, const std::string & timestampSeparator)
{
    std::stringstream ss;
    L::setStream(L::Level::Trace, ss);
    L::setLoggingLevel(L::Level::Trace);
    L().trace() << message;
    assertMessage(ss, message, timestampSeparator);
}